

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<bool>::MergeIntoEmpty
          (KeyMapBase<bool> *this,NodeBase *head,size_t num_nodes)

{
  NodeBase *pNVar1;
  NodeBase **ppNVar2;
  uint uVar3;
  uintptr_t v;
  size_type sVar4;
  Nonnull<const_char_*> failure_msg;
  int line;
  map_index_t new_num_buckets;
  ulong uVar5;
  long lVar6;
  KeyNode *node;
  LogMessageFatal LStack_38;
  
  uVar5 = (ulong)(this->super_UntypedMapBase).num_elements_;
  if (uVar5 == 0) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                            (uVar5,0,"size() == size_t{0}");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    if (num_nodes == 0) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              (0,0,"num_nodes != size_t{0}");
    }
    else {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    if (failure_msg == (Nonnull<const_char_*>)0x0) {
      sVar4 = CalculateCapacityForSize(num_nodes);
      uVar3 = (uint)sVar4;
      if ((this->super_UntypedMapBase).num_buckets_ != uVar3) {
        new_num_buckets = 2;
        if (2 < uVar3) {
          new_num_buckets = uVar3;
        }
        Resize(this,new_num_buckets);
      }
      (this->super_UntypedMapBase).num_elements_ = (map_index_t)num_nodes;
      AssertLoadFactor(this);
      if (head != (NodeBase *)0x0) {
        do {
          pNVar1 = head->next;
          uVar5 = ((ulong)(*(byte *)&head[1].next & 1) | 0x1976508) * -0x234dd359734ecb13;
          ppNVar2 = (this->super_UntypedMapBase).table_;
          uVar5 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                    (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                    (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                    (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^ (ulong)ppNVar2) *
                  -0x234dd359734ecb13;
          lVar6 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                    (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                    (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                    (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) ^ (ulong)ppNVar2) *
                  -0x234dd359734ecb13;
          InsertUnique(this,((uint)(byte)((ulong)lVar6 >> 0x38) |
                             ((uint)((ulong)lVar6 >> 0x20) & 0xff0000) >> 8 |
                             (uint)((ulong)lVar6 >> 0x18) & 0xff0000 |
                            (uint)((ulong)lVar6 >> 8) & 0xff000000) &
                            (this->super_UntypedMapBase).num_buckets_ - 1,(KeyNode *)head);
          head = pNVar1;
        } while (pNVar1 != (NodeBase *)0x0);
      }
      return;
    }
    line = 0x377;
  }
  else {
    line = 0x376;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

PROTOBUF_NOINLINE void MergeIntoEmpty(NodeBase* head, size_t num_nodes) {
    ABSL_DCHECK_EQ(size(), size_t{0});
    ABSL_DCHECK_NE(num_nodes, size_t{0});
    if (const map_index_t needed_capacity = CalculateCapacityForSize(num_nodes);
        needed_capacity != this->num_buckets_) {
      Resize(std::max(kMinTableSize, needed_capacity));
    }
    num_elements_ = num_nodes;
    AssertLoadFactor();
    while (head != nullptr) {
      KeyNode* node = static_cast<KeyNode*>(head);
      head = head->next;
      absl::PrefetchToLocalCacheNta(head);
      InsertUnique(BucketNumber(TS::ToView(node->key())), node);
    }
  }